

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O1

size_t __thiscall
ezc3d::ParametersNS::GroupNS::Group::parameterIdx(Group *this,string *parameterName)

{
  int iVar1;
  Parameter *pPVar2;
  string *psVar3;
  invalid_argument *this_00;
  long *plVar4;
  size_type *psVar5;
  ulong idx;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar6 = (this->_parameters).
          super__Vector_base<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_parameters).
          super__Vector_base<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (bVar6) {
    idx = 0;
    pPVar2 = parameter(this,0);
    psVar3 = Parameter::name_abi_cxx11_(pPVar2);
    iVar1 = std::__cxx11::string::compare((string *)psVar3);
    if (iVar1 != 0) {
      idx = 0;
      do {
        idx = idx + 1;
        bVar6 = idx < (ulong)(((long)(this->_parameters).
                                     super__Vector_base<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_parameters).
                                     super__Vector_base<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             0x2e8ba2e8ba2e8ba3);
        if (!bVar6) goto LAB_0012850a;
        pPVar2 = parameter(this,idx);
        psVar3 = Parameter::name_abi_cxx11_(pPVar2);
        iVar1 = std::__cxx11::string::compare((string *)psVar3);
      } while (iVar1 != 0);
    }
    if (bVar6) {
      return idx;
    }
  }
LAB_0012850a:
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_68,"Group::parameterIdx could not find ",parameterName);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_88._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_88._M_dataplus._M_p == psVar5) {
    local_88.field_2._M_allocated_capacity = *psVar5;
    local_88.field_2._8_8_ = plVar4[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar5;
  }
  local_88._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::operator+(&local_48,&local_88,&this->_name);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t ezc3d::ParametersNS::GroupNS::Group::parameterIdx(
    const std::string &parameterName) const {
  for (size_t i = 0; i < nbParameters(); ++i)
    if (!parameter(i).name().compare(parameterName))
      return i;
  throw std::invalid_argument("Group::parameterIdx could not find " +
                              parameterName + " in the group " + name());
}